

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::asDirectory
          (InMemoryDirectory *this,
          Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,EntryImpl *entry)

{
  Mutex *this_00;
  size_t sVar1;
  long in_RCX;
  ReadableDirectory *extraout_RDX;
  ReadableDirectory *extraout_RDX_00;
  ReadableDirectory *extraout_RDX_01;
  ReadableDirectory *extraout_RDX_02;
  _func_int **pp_Var3;
  String *pSVar4;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar5;
  PathPtr path;
  Path newPath;
  Path local_38;
  ReadableDirectory *pRVar2;
  
  if (*(int *)(in_RCX + 0x18) == 3) {
    SymlinkNode::parse(&local_38,(SymlinkNode *)(in_RCX + 0x20));
    this_00 = (Mutex *)(entry->name).content.ptr;
    if (this_00 != (Mutex *)0x0) {
      _::Mutex::unlock(this_00,SHARED,(Waiter *)0x0);
    }
    (entry->name).content.ptr = (char *)0x0;
    (entry->name).content.size_ = 0;
    path.parts.size_ = (size_t)local_38.parts.ptr;
    path.parts.ptr = (String *)lock;
    MVar5 = tryOpenSubdir(this,path);
    sVar1 = local_38.parts.size_;
    pSVar4 = local_38.parts.ptr;
    pRVar2 = MVar5.ptr.ptr;
    if (local_38.parts.ptr != (String *)0x0) {
      local_38.parts.ptr = (String *)0x0;
      local_38.parts.size_ = 0;
      (**(local_38.parts.disposer)->_vptr_ArrayDisposer)
                (local_38.parts.disposer,pSVar4,0x18,sVar1,sVar1,
                 ArrayDisposer::Dispose_<kj::String>::destruct);
      pRVar2 = extraout_RDX_00;
    }
  }
  else if (*(int *)(in_RCX + 0x18) == 2) {
    (**(code **)(**(long **)(in_RCX + 0x28) + 0x28))(&local_38);
    pp_Var3 = (_func_int **)local_38.parts.size_;
    if ((_func_int **)local_38.parts.size_ == (_func_int **)0x0) {
      pp_Var3 = (_func_int **)0x0;
      pSVar4 = (String *)0x0;
    }
    else {
      local_38.parts.size_ = 0;
      pSVar4 = local_38.parts.ptr;
    }
    sVar1 = local_38.parts.size_;
    pRVar2 = extraout_RDX;
    if ((_func_int **)local_38.parts.size_ != (_func_int **)0x0) {
      local_38.parts.size_ = 0;
      (**(code **)((local_38.parts.ptr)->content).ptr)
                (local_38.parts.ptr,sVar1 + *(long *)(*(_func_int **)sVar1 + -0x10));
      pRVar2 = extraout_RDX_02;
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)pSVar4
    ;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var3;
  }
  else {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              ((Fault *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x6a1,FAILED,(char *)0x0,"\"not a directory\"",(char (*) [16])0x21a8e0);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    _::Debug::Fault::~Fault((Fault *)&local_38);
    pRVar2 = extraout_RDX_01;
  }
  MVar5.ptr.ptr = pRVar2;
  MVar5.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)MVar5.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> asDirectory(
      kj::Locked<const Impl>& lock, const EntryImpl& entry) const {
    if (entry.node.is<DirectoryNode>()) {
      return entry.node.get<DirectoryNode>().directory->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenSubdir(newPath);
    } else {
      KJ_FAIL_REQUIRE("not a directory") { return kj::none; }
    }
  }